

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffComma(NodeDiffComputer *this,CommaExpr *lhs,CommaExpr *rhs)

{
  size_type_conflict sVar1;
  size_type_conflict sVar2;
  ArenaVector<SQCompilation::Expr_*> *this_00;
  ArenaVector<SQCompilation::Expr_*> *this_01;
  Expr **ppEVar3;
  CommaExpr *in_RDX;
  CommaExpr *in_RSI;
  NodeDiffComputer *in_RDI;
  int32_t tmp;
  Expr *r;
  Expr *l;
  int32_t i;
  int32_t result;
  ArenaVector<SQCompilation::Expr_*> *rightExpression;
  ArenaVector<SQCompilation::Expr_*> *leftExpressions;
  int32_t in_stack_ffffffffffffffb4;
  uint local_38;
  int local_34;
  int32_t local_4;
  
  this_00 = CommaExpr::expressions(in_RSI);
  this_01 = CommaExpr::expressions(in_RDX);
  sVar1 = ArenaVector<SQCompilation::Expr_*>::size(this_00);
  sVar2 = ArenaVector<SQCompilation::Expr_*>::size(this_01);
  if (sVar1 == sVar2) {
    local_34 = 0;
    for (local_38 = 0; sVar2 = ArenaVector<SQCompilation::Expr_*>::size(this_00), local_38 < sVar2;
        local_38 = local_38 + 1) {
      ArenaVector<SQCompilation::Expr_*>::operator[](this_00,local_38);
      ppEVar3 = ArenaVector<SQCompilation::Expr_*>::operator[](this_01,local_38);
      in_stack_ffffffffffffffb4 =
           diffNodes((NodeDiffComputer *)*ppEVar3,(Node *)CONCAT44(in_stack_ffffffffffffffb4,sVar1),
                     (Node *)in_RDI);
      if (in_RDI->limit < in_stack_ffffffffffffffb4) {
        return in_stack_ffffffffffffffb4;
      }
      local_34 = in_stack_ffffffffffffffb4 + local_34;
    }
    local_4 = local_34;
  }
  else {
    sVar1 = ArenaVector<SQCompilation::Expr_*>::size(this_00);
    sVar2 = ArenaVector<SQCompilation::Expr_*>::size(this_01);
    local_4 = sizeDiff(in_RDI,sVar1,sVar2);
  }
  return local_4;
}

Assistant:

int32_t diffComma(const CommaExpr *lhs, const CommaExpr *rhs) {
    const auto &leftExpressions = lhs->expressions();
    const auto &rightExpression = rhs->expressions();

    if (leftExpressions.size() != rightExpression.size())
      return sizeDiff(leftExpressions.size(), rightExpression.size());

    int32_t result = 0;

    for (int32_t i = 0; i < leftExpressions.size(); ++i) {
      const Expr *l = leftExpressions[i];
      const Expr *r = rightExpression[i];

      int32_t tmp = diffNodes(l, r);

      if (tmp > limit)
        return tmp;

      result += tmp;
    }

    return result;
  }